

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

CTPNStmTop * __thiscall CTcParser::parse_grammar(CTcParser *this,int *err,int replace,int modify)

{
  tc_toktyp_t tVar1;
  CTcToken *pCVar2;
  char *__src;
  CTcSymObjBase *pCVar3;
  CTPNStmTop *pCVar4;
  undefined8 *puVar5;
  CTcParser *pCVar6;
  int in_ECX;
  tc_toktyp_t in_EDX;
  CTcSymProp *in_RSI;
  CTcParser *in_RDI;
  size_t i;
  CTcConstVal cval;
  CTPNList *lst;
  CTPNStmObject *stm;
  CTcGramAltFuncsStatic funcs;
  CTcGramPropArrows arrows;
  int trans;
  int is_class;
  size_t copy_len;
  size_t sub_tag_len;
  char *sub_tag;
  size_t name_tag_len;
  char *name_tag;
  char tag_buf [192];
  int is_anon;
  CTcGramProdEntry *prod;
  CTcToken prod_name;
  int need_private_prod;
  CTcSymObj *mod_orig_sym;
  CTcSymObj *gram_obj;
  undefined8 in_stack_fffffffffffffa48;
  uint errnum;
  CTcConstVal *val;
  CTcTokenizer *in_stack_fffffffffffffa50;
  CTcTokenizer *this_00;
  undefined4 uVar7;
  CTcConstVal *this_01;
  CTcTokenizer *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa64;
  CTcTokenizer *in_stack_fffffffffffffa68;
  CTcPrsNode *expr;
  CTcSymObjBase *in_stack_fffffffffffffa70;
  CTPNListBase *this_02;
  undefined4 in_stack_fffffffffffffa78;
  int is_static;
  int in_stack_fffffffffffffa7c;
  CTcSymObj *in_stack_fffffffffffffa80;
  CTcSymProp *in_stack_fffffffffffffa88;
  CTPNStmTop *prop_sym;
  CTPNObjDef *in_stack_fffffffffffffa90;
  CTPNObjDef *this_03;
  CTcDictEntry *in_stack_fffffffffffffa98;
  textchar_t *in_stack_fffffffffffffaa0;
  int *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf4;
  char *__dest;
  char *in_stack_fffffffffffffb00;
  ulong local_4f0;
  undefined8 in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  CTcSymProp *in_stack_fffffffffffffb78;
  CTcGramPropArrows *in_stack_fffffffffffffb80;
  CTcGramProdEntry *in_stack_fffffffffffffb88;
  CTcSymObj *in_stack_fffffffffffffb90;
  CTcSymProp *in_stack_fffffffffffffb98;
  CTcParser *in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffc0c;
  int in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  CTcSymObj *in_stack_fffffffffffffc18;
  CTcSymProp *in_stack_fffffffffffffc20;
  CTcParser *in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc48;
  CTcSymObj *in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc58;
  CTcSymMetaclass *in_stack_fffffffffffffc60;
  tcprs_term_info *in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc70;
  ulong local_180;
  undefined1 local_168 [308];
  int local_34;
  CTcSymProp *local_30;
  CTcSymObjBase *local_28;
  int local_20;
  tc_toktyp_t local_1c;
  CTcSymProp *local_18;
  
  errnum = (uint)((ulong)in_stack_fffffffffffffa48 >> 0x20);
  local_28 = (CTcSymObjBase *)0x0;
  local_30 = (CTcSymProp *)0x0;
  local_34 = 0;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  CTcToken::CTcToken((CTcToken *)(local_168 + 0x108));
  CTcToken::set_text((CTcToken *)(local_168 + 0x108),"?",1);
  local_168._256_8_ = (CTcGramProdEntry *)0x0;
  local_168._252_4_ = 1;
  tVar1 = CTcTokenizer::next(in_stack_fffffffffffffa58);
  if (tVar1 == TOKT_SYM) {
    pCVar2 = CTcTokenizer::copycur(in_stack_fffffffffffffa68);
    memcpy(local_168 + 0x108,pCVar2,0x21);
    in_stack_fffffffffffffb00 = CTcToken::get_text((CTcToken *)(local_168 + 0x108));
    CTcToken::get_text_len((CTcToken *)(local_168 + 0x108));
    local_168._256_8_ =
         declare_gramprod((CTcParser *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60)
                          ,(char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
  }
  else {
    CTcTokenizer::log_error_curtok(in_stack_fffffffffffffa50,errnum);
  }
  local_168._40_8_ = CTcToken::get_text((CTcToken *)(local_168 + 0x108));
  local_168._32_8_ = CTcToken::get_text_len((CTcToken *)(local_168 + 0x108));
  local_168._24_8_ = (CCharmapToUni *)0x0;
  local_168._16_8_ = (char *)0x0;
  tVar1 = CTcTokenizer::next(in_stack_fffffffffffffa58);
  if (tVar1 == TOKT_LPAR) {
    CTcTokenizer::next(in_stack_fffffffffffffa58);
    pCVar2 = CTcTokenizer::getcur(G_tok);
    local_168._8_8_ = CTcToken::get_text_len(pCVar2);
    if ((CResLoader *)(0xbe - local_168._32_8_) < (ulong)local_168._8_8_) {
      local_168._8_8_ = 0xbe - local_168._32_8_;
    }
    pCVar2 = CTcTokenizer::getcur(G_tok);
    local_168._24_8_ = CTcToken::get_text(pCVar2);
    pCVar2 = CTcTokenizer::getcur(G_tok);
    local_168._16_8_ = CTcToken::get_text_len(pCVar2);
    memcpy(local_168 + 0x30,(void *)local_168._40_8_,local_168._32_8_);
    ((tctok_incfile_t *)(local_168._32_8_ + 0x30))->fname[(long)(local_168 + -8)] = '(';
    __dest = ((tctok_incfile_t *)(local_168._32_8_ + 0x30))->fname + (long)(local_168 + -7);
    pCVar2 = CTcTokenizer::getcur(G_tok);
    __src = CTcToken::get_text(pCVar2);
    memcpy(__dest,__src,local_168._8_8_);
    (&((tctok_incfile_t *)(local_168._32_8_ + -0x140))->field_0x9 + local_168._8_8_)
    [(long)&stack0x00000000] = 0x29;
    local_168._32_8_ = (undefined1 *)((long)(char **)local_168._8_8_ + 2) + local_168._32_8_;
    local_168._40_8_ =
         CTcTokenizer::store_source
                   ((CTcTokenizer *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                    (char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    tVar1 = CTcTokenizer::next(in_stack_fffffffffffffa58);
    if (tVar1 == TOKT_RPAR) {
      CTcTokenizer::next(in_stack_fffffffffffffa58);
    }
    else {
      CTcTokenizer::log_error_curtok(in_stack_fffffffffffffa50,errnum);
    }
    local_168._4_4_ = NEWLINE_SPACING_COLLAPSE;
    local_168._0_4_ = 0;
    pCVar6 = (CTcParser *)&stack0xffffffffffffffd0;
    in_stack_fffffffffffffa58 = (CTcTokenizer *)local_168;
    this_00 = (CTcTokenizer *)0x0;
    local_28 = &find_or_def_obj(in_RDI,in_stack_fffffffffffffb00,(size_t)__dest,
                                in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0,
                                in_stack_fffffffffffffae8,(CTcSymObj **)in_stack_fffffffffffffb20,
                                (CTcSymMetaclass **)in_stack_fffffffffffffb28,
                                (int *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
                               )->super_CTcSymObjBase;
    local_168._252_4_ = 0;
    local_34 = 1;
  }
  else {
    if (((local_1c == TOKT_INVALID) && (local_20 == 0)) &&
       (tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x218c56), tVar1 == TOKT_SEM)) {
      if ((CTcGramProdEntry *)local_168._256_8_ != (CTcGramProdEntry *)0x0) {
        CTcGramProdEntry::set_declared((CTcGramProdEntry *)local_168._256_8_,1);
      }
      CTcTokenizer::next(in_stack_fffffffffffffa58);
      return (CTPNStmTop *)0x0;
    }
    pCVar3 = (CTcSymObjBase *)CTcSymbolBase::operator_new(0x218ca2);
    CTcGenTarg::new_obj_id(G_cg);
    this_00 = (CTcTokenizer *)0x0;
    pCVar6 = (CTcParser *)((ulong)errnum << 0x20);
    CTcSymObj::CTcSymObj
              (in_stack_fffffffffffffa80,
               (char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (size_t)in_stack_fffffffffffffa70,(int)((ulong)in_stack_fffffffffffffa68 >> 0x20),
               (vm_obj_id_t)in_stack_fffffffffffffa68,in_stack_fffffffffffffa64,
               (tc_metaclass_t)in_stack_fffffffffffffa90,in_stack_fffffffffffffa98);
    local_28 = pCVar3;
    if ((local_1c != TOKT_INVALID) || (local_20 != 0)) {
      CTcTokenizer::log_error(0x2bc0);
    }
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x218d6c);
  if (tVar1 == TOKT_COLON) {
    CTcTokenizer::next(in_stack_fffffffffffffa58);
  }
  else {
    CTcTokenizer::log_error_curtok(this_00,(int)((ulong)pCVar6 >> 0x20));
  }
  if (local_28 != (CTcSymObjBase *)0x0) {
    CTcSymObjBase::set_is_class(local_28,1);
  }
  CTcGramPropArrows::CTcGramPropArrows((CTcGramPropArrows *)&stack0xfffffffffffffb60);
  if ((local_20 == 0) || (tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x218dd9), tVar1 != TOKT_COLON))
  {
    if ((local_34 != 0) && (local_28 != (CTcSymObjBase *)0x0)) {
      CTcToken::get_text((CTcToken *)(local_168 + 0x108));
      CTcToken::get_text_len((CTcToken *)(local_168 + 0x108));
      local_168._256_8_ =
           CTcSymObjBase::create_grammar_entry
                     (in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68,
                      CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    }
    CTcGramAltFuncsStatic::CTcGramAltFuncsStatic((CTcGramAltFuncsStatic *)this_00,pCVar6);
    uVar7 = (undefined4)((ulong)this_00 >> 0x20);
    parse_gram_alts(in_stack_fffffffffffffba0,(int *)in_stack_fffffffffffffb98,
                    in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                    (CTcGramAltFuncs *)in_stack_fffffffffffffb78);
    if (*(int *)&(local_18->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry != 0) {
      return (CTPNStmTop *)0x0;
    }
  }
  else {
    CTcTokenizer::next(in_stack_fffffffffffffa58);
    uVar7 = (undefined4)((ulong)this_00 >> 0x20);
  }
  val = (CTcConstVal *)((ulong)pCVar6 & 0xffffffff00000000);
  this_01 = (CTcConstVal *)CONCAT44(uVar7,local_20);
  expr = (CTcPrsNode *)0x0;
  this_02 = (CTPNListBase *)0x0;
  is_static = 0;
  pCVar4 = (CTPNStmTop *)
           parse_object_body(in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20,
                             in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
                             in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
                             in_stack_fffffffffffffc40,in_stack_fffffffffffffc48,
                             in_stack_fffffffffffffc50,in_stack_fffffffffffffc58,
                             in_stack_fffffffffffffc60,in_stack_fffffffffffffc68,
                             in_stack_fffffffffffffc70);
  if (pCVar4 != (CTPNStmTop *)0x0) {
    CTcConstVal::CTcConstVal((CTcConstVal *)&stack0xfffffffffffffb18);
    puVar5 = (undefined8 *)CTcPrsAllocObj::operator_new(0x218f66);
    puVar5[8] = 0;
    puVar5[9] = 0;
    puVar5[6] = 0;
    puVar5[7] = 0;
    puVar5[4] = 0;
    puVar5[5] = 0;
    puVar5[2] = 0;
    puVar5[3] = 0;
    *puVar5 = 0;
    puVar5[1] = 0;
    CTPNList::CTPNList((CTPNList *)this_01);
    CTcConstVal::set_sstr(this_01,(char *)val,0x218fc3);
    CTcPrsAllocObj::operator_new(0x218fda);
    CTPNConst::CTPNConst((CTPNConst *)this_01,val);
    CTPNListBase::add_element(this_02,expr);
    for (local_4f0 = 0; local_4f0 < local_180; local_4f0 = local_4f0 + 1) {
      pCVar6 = (CTcParser *)CTcSymbolBase::get_sym((CTcSymbolBase *)0x21904a);
      CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x219064);
      create_sym_node(pCVar6,in_stack_fffffffffffffaa0,(size_t)in_stack_fffffffffffffa98);
      CTPNListBase::add_element(this_02,expr);
    }
    CTPNObjDef::add_prop
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
               (CTcPrsNode *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c,is_static);
    CTcConstVal::set_sstr(this_01,(char *)val,0x219145);
    prop_sym = pCVar4 + 1;
    this_03 = (CTPNObjDef *)in_RDI->gramtag_prop_;
    CTcPrsAllocObj::operator_new(0x219174);
    CTPNConst::CTPNConst((CTPNConst *)this_01,val);
    CTPNObjDef::add_prop
              (this_03,(CTcSymProp *)prop_sym,(CTcPrsNode *)in_stack_fffffffffffffa80,
               in_stack_fffffffffffffa7c,is_static);
  }
  return pCVar4;
}

Assistant:

CTPNStmTop *CTcParser::parse_grammar(int *err, int replace, int modify)
{
    /* no GrammarProd object yet */
    CTcSymObj *gram_obj = 0;

    /* presume we're not modifying anything */
    CTcSymObj *mod_orig_sym = 0;

    /* presume we won't need a private production object */
    int need_private_prod = FALSE;

    /* presume we won't find a valid production name */
    CTcToken prod_name;
    prod_name.set_text("?", 1);
    CTcGramProdEntry *prod = 0;

    /* presume it will be anonymous (i.e., no name tag) */
    int is_anon = TRUE;

    /* skip the 'grammar' token and check for the production name */
    if (G_tok->next() != TOKT_SYM)
    {
        /* log an error, then proceed without a symbol name */
        G_tok->log_error_curtok(TCERR_GRAMMAR_REQ_SYM);
    }
    else
    {
        /* remember the production name */
        prod_name = *G_tok->copycur();

        /* find or create the 'grammar production' entry */
        prod = declare_gramprod(prod_name.get_text(),
                                prod_name.get_text_len());
    }

    /* use the production name as the name tag */
    char tag_buf[TOK_SYM_MAX_LEN*2 + 32];
    const char *name_tag = prod_name.get_text();
    size_t name_tag_len = prod_name.get_text_len();

    /* presume there'll be no sub-tag */
    const char *sub_tag = 0;
    size_t sub_tag_len = 0;

    /* check for the optional name-tag token */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the paren - the name token follows */
        G_tok->next();

        /* 
         *   limit the added copying so we don't overflow our buffer - note
         *   that we need two bytes for parens 
         */
        size_t copy_len = G_tok->getcur()->get_text_len();
        if (copy_len > sizeof(tag_buf) - name_tag_len - 2)
            copy_len = sizeof(tag_buf) - name_tag_len - 2;

        /* remember the sub-tag */
        sub_tag = G_tok->getcur()->get_text();
        sub_tag_len = G_tok->getcur()->get_text_len();

        /* build the name */
        memcpy(tag_buf, name_tag, name_tag_len);
        tag_buf[name_tag_len] = '(';
        memcpy(tag_buf + name_tag_len + 1,
               G_tok->getcur()->get_text(), copy_len);
        tag_buf[name_tag_len + 1 + copy_len] = ')';

        /* store the tag in tokenizer memory */
        name_tag_len += 2 + copy_len;
        name_tag = G_tok->store_source(tag_buf, name_tag_len);

        /* require the closing paren */
        if (G_tok->next() == TOKT_RPAR)
        {
            /* found it - skip it */
            G_tok->next();
        }
        else
        {
            /* flag the error, but proceed as though it was there */
            G_tok->log_error_curtok(TCERR_GRAMMAR_REQ_NAME_RPAR);
        }

        /*
         *   There's a tag, so the grammar match object has a symbol name
         *   given by the full "prod(tag)" string.  Note that grammar match
         *   definitions are inherently classes.  
         */
        int is_class = TRUE;
        int trans = FALSE;
        gram_obj = find_or_def_obj(name_tag, name_tag_len,
                                   replace, modify, &is_class,
                                   &mod_orig_sym, 0, &trans);

        /* note that the object is named */
        is_anon = FALSE;

        /*
         *   Since this is a named grammar match object, we must keep the
         *   list of grammar rules defined here in a private list.  At link
         *   time, we'll merge this private grammar rule list with the
         *   master list for the production, but we must keep a private list
         *   until link time in case this match object is modified or
         *   replaced.  
         */
        need_private_prod = TRUE;
    }
    else if (!replace && !modify && G_tok->cur() == TOKT_SEM)
    {
        /* 
         *   It's an empty 'grammar x;' statement, with no rule definition
         *   and no properties.  This is a simple declaration of the
         *   production name and defines no rules for it; the only thing we
         *   have to do is mark the production object as explicitly declared.
         */
        if (prod != 0)
            prod->set_declared(TRUE);

        /* skip the semicolon */
        G_tok->next();

        /* 
         *   we're done - a simple grammar production declaration generates
         *   no parse tree object 
         */
        return 0;
    }
    else
    {
        /* 
         *   There's no tag, so the grammar match object is anonymous.
         *   Create a new anonymous object symbol for it.  
         */
        gram_obj = new CTcSymObj(".anon", 5, FALSE, G_cg->new_obj_id(),
                                 FALSE, TC_META_TADSOBJ, 0);

        /* 
         *   'replace' and 'modify' can only be used with tagged grammar
         *   rules, since that's the only way we can refer to a specific rule
         *   previously defined 
         */
        if (replace || modify)
            G_tok->log_error(TCERR_GRAMMAR_MOD_REQ_TAG);
    }

    /* check for and skip the required colon */
    if (G_tok->cur() == TOKT_COLON)
    {
        /* it's there - skip it and proceed */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, then proceed on the assumption that the colon
         *   was simply omitted 
         */
        G_tok->log_error_curtok(TCERR_GRAMMAR_REQ_COLON);
    }

    /* 
     *   mark it as a class - this object exists as a factory for match tree
     *   instances 
     */
    if (gram_obj != 0)
        gram_obj->set_is_class(TRUE);

    /*
     *   If we're modifying the rule, check for an empty rule list.  With
     *   'modify', an empty rule list has the special meaning that we retain
     *   the original rule list of the base object being modified.  
     */
    CTcGramPropArrows arrows;
    if (modify && G_tok->cur() == TOKT_COLON)
    {
        /* 
         *   This is a 'modify', and the rule list is empty.  This means that
         *   we're to leave the original rule list of the base object intact,
         *   so we don't need to flatten the input syntax (since there's no
         *   input syntax to flatten), we don't need to create a new private
         *   list (since we want to leave the existing private list intact),
         *   and we don't need to set up the first alternative for the rule
         *   (since there will be no alternatives at all).  
         */
        G_tok->next();
    }
    else
    {
        /* 
         *   We don't have an empty 'modify' rule list, so we're defining a
         *   rule list for this production.  If we decided that we need to
         *   store the list in a private list, create the private list.  
         */
        if (need_private_prod && gram_obj != 0)
            prod = gram_obj->create_grammar_entry(
                prod_name.get_text(), prod_name.get_text_len());

        /* parse the token specification list */
        CTcGramAltFuncsStatic funcs(this);
        parse_gram_alts(err, gram_obj, prod, &arrows, &funcs);
        if (*err != 0)
            return 0;
    }

    /* parse the object body */
    CTPNStmObject *stm = parse_object_body(
        err, gram_obj, TRUE, is_anon, TRUE, FALSE, modify, mod_orig_sym,
        0, 0, 0, FALSE);

    /*
     *   Add the grammarInfo property.  This property is a method that
     *   returns a list whose first element is the match's name tag, and
     *   whose subsequent elements are the arrow-assigned properties.
     *   
     *   This is only necessary if we managed to create a statement object.  
     */
    if (stm != 0)
    {
        CTPNList *lst;
        CTcConstVal cval;
        size_t i;

        /* create the list expression */
        lst = new CTPNList();

        /* add the name-tag string element */
        cval.set_sstr(name_tag, name_tag_len);
        lst->add_element(new CTPNConst(&cval));

        /* add each property to the list */
        for (i = 0 ; i < arrows.cnt ; ++i)
        {
            /* add a node to evaluate this property symbol */
            lst->add_element(create_sym_node(arrows.prop[i]->get_sym(),
                                             arrows.prop[i]->get_sym_len()));
        }

        /* add a property for this */
        stm->add_prop(graminfo_prop_, lst, FALSE, FALSE);

        /* add a grammarTag property with the tag name */
        cval.set_sstr(sub_tag, sub_tag_len);
        stm->add_prop(gramtag_prop_, new CTPNConst(&cval), FALSE, FALSE);
    }

    /* return the object definition statement */
    return stm;
}